

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O0

void pzshape::TPZShapeTetra::CornerShape
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double *pdVar2;
  TPZVec<double> *in_RDI;
  int64_t in_stack_ffffffffffffffd0;
  double dVar3;
  int64_t in_stack_ffffffffffffffd8;
  double dVar4;
  TPZFMatrix<double> *in_stack_ffffffffffffffe0;
  TPZFMatrix<double> *this;
  
  pdVar2 = TPZVec<double>::operator[](in_RDI,0);
  dVar3 = *pdVar2;
  pdVar2 = TPZVec<double>::operator[](in_RDI,1);
  dVar4 = *pdVar2;
  pdVar2 = TPZVec<double>::operator[](in_RDI,2);
  dVar1 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)
  ;
  *pdVar2 = ((1.0 - dVar3) - dVar4) - dVar1;
  pdVar2 = TPZVec<double>::operator[](in_RDI,0);
  dVar3 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int64_t)dVar3);
  *pdVar2 = dVar3;
  pdVar2 = TPZVec<double>::operator[](in_RDI,1);
  dVar4 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()(in_stack_ffffffffffffffe0,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = dVar4;
  pdVar2 = TPZVec<double>::operator[](in_RDI,2);
  this = (TPZFMatrix<double> *)*pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = (double)this;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = -1.0;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = -1.0;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = -1.0;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = 1.0;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = 1.0;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = 0.0;
  pdVar2 = TPZFMatrix<double>::operator()(this,(int64_t)dVar4,(int64_t)dVar3);
  *pdVar2 = 1.0;
  return;
}

Assistant:

void TPZShapeTetra::CornerShape(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
		phi(0,0)  = 1-pt[0]-pt[1]-pt[2];
		phi(1,0)  = pt[0];
		phi(2,0)  = pt[1];
		phi(3,0)  = pt[2];
		
		dphi(0,0) = -1.0;
		dphi(1,0) = -1.0;
		dphi(2,0) = -1.0;
		dphi(0,1) =  1.0;
		dphi(1,1) =  0.0;
		dphi(2,1) =  0.0;
		dphi(0,2) =  0.0;
		dphi(1,2) =  1.0;
		dphi(2,2) =  0.0;
		dphi(0,3) =  0.0;
		dphi(1,3) =  0.0;
		dphi(2,3) =  1.0;
	}